

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint64 tag,char *ptr,MessageLite *containing_type,
          InternalMetadataWithArenaLite *metadata,ParseContext *ctx)

{
  bool bVar1;
  char *pcVar2;
  int field_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  GeneratedExtensionFinder finder;
  bool local_61;
  ExtensionInfo local_60;
  ExtensionFinder local_40;
  MessageLite *local_38;
  
  local_40._vptr_ExtensionFinder = (_func_int **)&PTR__ExtensionFinder_00470af0;
  field_number = (int)(tag >> 3);
  local_38 = containing_type;
  bVar1 = FindExtensionInfoFromFieldNumber
                    (this,(uint)tag & 7,field_number,&local_40,&local_60,&local_61);
  if (bVar1) {
    pcVar2 = ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArenaLite>
                       (this,field_number,local_61,&local_60,metadata,ptr,ctx);
  }
  else {
    if ((*(ulong *)metadata & 1) == 0) {
      unknown = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                ::mutable_unknown_fields_slow
                          ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                            *)metadata);
    }
    else {
      unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(ulong *)metadata & 0xfffffffffffffffe);
    }
    pcVar2 = UnknownFieldParse((uint)tag,unknown,ptr,ctx);
  }
  return pcVar2;
}

Assistant:

const char* ExtensionSet::ParseField(
    uint64 tag, const char* ptr, const MessageLite* containing_type,
    internal::InternalMetadataWithArenaLite* metadata,
    internal::ParseContext* ctx) {
  GeneratedExtensionFinder finder(containing_type);
  int number = tag >> 3;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromFieldNumber(tag & 7, number, &finder, &extension,
                                        &was_packed_on_wire)) {
    return UnknownFieldParse(tag, metadata->mutable_unknown_fields(), ptr, ctx);
  }
  return ParseFieldWithExtensionInfo(number, was_packed_on_wire, extension,
                                     metadata, ptr, ctx);
}